

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

void setup::anon_unknown_21::check_is_end(pointer *is,char *what)

{
  basic_istream<char,_std::char_traits<char>_> *pbVar1;
  _func_int *p_Var2;
  long *plVar3;
  char *pcVar4;
  char dummy;
  
  pbVar1 = (is->_M_t).
           super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
           .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
           _M_head_impl;
  p_Var2 = pbVar1->_vptr_basic_istream[0xfffffffffffffffd];
  *(undefined4 *)(&pbVar1->field_0x1c + (long)p_Var2) = 0;
  std::ios::clear((int)pbVar1 + (int)p_Var2);
  plVar3 = (long *)std::istream::get((char *)(is->_M_t).
                                             super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                             ._M_head_impl);
  if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 2) != 0) {
    return;
  }
  pcVar4 = (char *)__cxa_allocate_exception(0x20);
  std::iostream_category();
  std::ios_base::failure[abi:cxx11]::failure(pcVar4,(error_code *)what);
  __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void check_is_end(stream::block_reader::pointer & is, const char * what) {
	is->exceptions(std::ios_base::goodbit);
	char dummy;
	if(!is->get(dummy).eof()) {
		throw std::ios_base::failure(what);
	}
}